

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxReduce_AllReduceVec_Test::TestBody(MxxReduce_AllReduceVec_Test *this)

{
  datatype *pdVar1;
  MPI_Datatype poVar2;
  int i;
  long lVar3;
  int iVar4;
  ulong __n;
  datatype *this_00;
  char *pcVar5;
  long lVar6;
  int n;
  datatype dt;
  AssertionResult gtest_ar;
  undefined4 uStack_f0;
  MPI_Datatype local_d0;
  MPI_Op local_c8;
  comm local_c0;
  vector<int,_std::allocator<int>_> w;
  int mysize;
  undefined4 uStack_84;
  vector<int,_std::allocator<int>_> v;
  comm c;
  int local_34;
  
  mxx::comm::comm(&c);
  n = 10;
  std::vector<int,_std::allocator<int>_>::vector(&v,10,(allocator_type *)&gtest_ar);
  iVar4 = 10;
  for (lVar3 = 0; lVar3 < iVar4; lVar3 = lVar3 + 1) {
    v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[lVar3]
         = (int)lVar3;
    iVar4 = n;
  }
  mxx::comm::comm((comm *)&gtest_ar);
  mxx::allreduce<int,std::plus<int>>(&w,(mxx *)&v,&gtest_ar);
  mxx::comm::~comm((comm *)&gtest_ar);
  dt._vptr_datatype =
       (_func_int **)
       CONCAT44(dt._vptr_datatype._4_4_,
                (int)((ulong)((long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2));
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"n","(int)w.size()",&n,(int *)&dt);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&dt);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0xc4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&dt);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar3 = 0;
    for (lVar6 = 0; lVar6 < n; lVar6 = lVar6 + 1) {
      dt._vptr_datatype = (_func_int **)CONCAT44(dt._vptr_datatype._4_4_,c.m_size * (int)lVar6);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"c.size()*i","w[i]",(int *)&dt,
                 (int *)((long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&dt);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0xc6,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&dt);
        goto LAB_0010c5dc;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar3 = lVar3 + 4;
    }
    mxx::comm::split(&local_c0,&c,c.m_rank % 2);
    __n = (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start >> 2;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&mysize,__n,(allocator_type *)&gtest_ar);
    gtest_ar._0_8_ = &PTR__custom_op_00142cc8;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    dt.builtin = false;
    dt._17_7_ = 0;
    dt._vptr_datatype = (_func_int **)0x0;
    dt.mpitype = (MPI_Datatype)0x0;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x10);
    poVar2 = dt.mpitype;
    ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p =
         (pointer)mxx::custom_op<int>::custom_function<MxxReduce_AllReduceVec_Test::TestBody()::__0>
    ;
    dt._vptr_datatype = (_func_int **)0x0;
    dt.mpitype = (MPI_Datatype)0x0;
    dt.builtin = false;
    dt._17_7_ = 0;
    std::_Function_base::~_Function_base((_Function_base *)&dt);
    dt._vptr_datatype = (_func_int **)&PTR__datatype_00142cf8;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt.builtin = true;
    MPI_Type_dup(&ompi_mpi_int,&local_d0);
    local_34 = 0x543;
    mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
              (&local_d0,&local_34,
               (function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)&gtest_ar.message_);
    MPI_Op_create(mxx::custom_op<int>::mpi_user_function,1,&local_c8);
    mxx::datatype::~datatype(&dt);
    MPI_Allreduce(v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start,CONCAT44(uStack_84,mysize),__n & 0xffffffff,local_d0,local_c8,
                  local_c0.mpi_comm);
    mxx::custom_op<int>::~custom_op((custom_op<int> *)&gtest_ar);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&w,(_Vector_base<int,_std::allocator<int>_> *)&mysize);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&mysize);
    mxx::comm::~comm(&local_c0);
    mysize = c.m_size / 2;
    if ((c.m_rank & 1U) == 0 && (c.m_size & 0x80000001U) == 1) {
      mysize = mysize + 1;
    }
    mxx::comm::split((comm *)&gtest_ar,&c,c.m_rank % 2);
    uStack_f0 = SUB84(poVar2,0);
    local_c0._vptr_comm._0_4_ = uStack_f0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&dt,"mysize","c.split(c.rank() % 2).size()",&mysize,(int *)&local_c0);
    mxx::comm::~comm((comm *)&gtest_ar);
    if ((char)dt._vptr_datatype == '\0') {
      testing::Message::Message((Message *)&gtest_ar);
      if (dt.mpitype == (MPI_Datatype)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)dt.mpitype;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0xcd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&gtest_ar);
      pdVar1 = &dt;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      this_00 = (datatype *)&gtest_ar;
      goto LAB_0010c583;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&dt.mpitype);
    dt._vptr_datatype =
         (_func_int **)
         CONCAT44(dt._vptr_datatype._4_4_,
                  (int)((ulong)((long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2));
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"n","(int)w.size()",&n,(int *)&dt)
    ;
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar3 = 0;
      lVar6 = 0;
LAB_0010c4d0:
      if (lVar6 < n) {
        dt._vptr_datatype = (_func_int **)CONCAT44(dt._vptr_datatype._4_4_,mysize * (int)lVar6);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"mysize*i","w[i]",(int *)&dt,
                   (int *)((long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar3));
        if (gtest_ar.success_ != false) goto code_r0x0010c514;
        testing::Message::Message((Message *)&dt);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0xd0,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&dt);
LAB_0010c5dc:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&dt);
        pdVar1 = (datatype *)&gtest_ar;
        goto LAB_0010c5f5;
      }
      goto LAB_0010c5fa;
    }
    testing::Message::Message((Message *)&dt);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0xce,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&dt);
  }
  pdVar1 = (datatype *)&gtest_ar;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
  this_00 = &dt;
LAB_0010c583:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_0010c5f5:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pdVar1->mpitype);
LAB_0010c5fa:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&w.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  mxx::comm::~comm(&c);
  return;
code_r0x0010c514:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  lVar6 = lVar6 + 1;
  lVar3 = lVar3 + 4;
  goto LAB_0010c4d0;
}

Assistant:

TEST(MxxReduce, AllReduceVec) {
    mxx::comm c;

    int n = 10; // numbers per rank

    std::vector<int> v(n);
    for (int i = 0; i < n; ++i) {
        v[i] = i;
    }

    std::vector<int> w = mxx::allreduce(v);
    ASSERT_EQ(n, (int)w.size());
    for (int i = 0; i < n; ++i) {
        ASSERT_EQ(c.size()*i, w[i]);
    }

    w = mxx::allreduce(v, [](int x, int y) { return x+y; }, c.split(c.rank() % 2));
    int mysize = c.size() / 2;
    if (c.size() % 2 == 1 && c.rank() % 2 == 0)
        ++mysize;
    ASSERT_EQ(mysize, c.split(c.rank() % 2).size());
    ASSERT_EQ(n, (int)w.size());
    for (int i = 0; i < n; ++i) {
        ASSERT_EQ(mysize*i, w[i]);
    }
}